

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O2

void * NES_DMC_np_Create(UINT32 clock,UINT32 rate)

{
  uint uVar1;
  void *chip;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  NES_DMC *dmc;
  uint uVar6;
  
  chip = calloc(1,0x40128);
  if (chip != (void *)0x0) {
    *(UINT32 *)((long)chip + 0x40094) = clock;
    uVar6 = clock - 0x195e8f;
    uVar1 = -uVar6;
    if (0 < (int)uVar6) {
      uVar1 = uVar6;
    }
    uVar4 = 0x1d22;
    if (uVar1 < 0x3e9) {
      uVar4 = 0x207a;
    }
    *(uint *)((long)chip + 0x4009c) = (uint)(uVar1 < 0x3e9);
    *(undefined4 *)((long)chip + 0x40104) = uVar4;
    NES_DMC_np_SetRate(chip,rate);
    *(undefined8 *)((long)chip + 0x40008) = 0x100000001;
    *(undefined8 *)((long)chip + 0x40010) = 0x100000001;
    *(undefined8 *)((long)chip + 0x40018) = 0x100000000;
    *(undefined8 *)((long)chip + 0x40020) = 1;
    *(undefined4 *)((long)chip + 8) = 0;
    *(undefined4 *)((long)chip + 0x20008) = 0;
    *(undefined8 *)((long)chip + 0x400f8) = 0;
    *(undefined8 *)((long)chip + 0x40100) = 0x1d2200000000;
    *(undefined4 *)((long)chip + 0x4010c) = 4;
    lVar2 = (long)chip + 0x4002c;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        *(undefined4 *)(lVar2 + lVar5 * 4) = 0x80;
      }
      lVar2 = lVar2 + 0xc;
    }
  }
  return chip;
}

Assistant:

void* NES_DMC_np_Create(UINT32 clock, UINT32 rate)
{
	NES_DMC* dmc;
	int c, t;

	dmc = (NES_DMC*)calloc(1, sizeof(NES_DMC));
	if (dmc == NULL)
		return NULL;

	NES_DMC_np_SetClock(dmc, clock);
	NES_DMC_np_SetRate(dmc, rate);
	dmc->option[OPT_ENABLE_4011] = 1;
	dmc->option[OPT_ENABLE_PNOISE] = 1;
	dmc->option[OPT_UNMUTE_ON_RESET] = 1;
	dmc->option[OPT_DPCM_ANTI_CLICK] = 0;
	dmc->option[OPT_NONLINEAR_MIXER] = 1;
	dmc->option[OPT_RANDOMIZE_NOISE] = 1;
	dmc->option[OPT_TRI_MUTE] = 1;
	dmc->option[OPT_TRI_NULL] = 0;
	dmc->tnd_table[0][0][0][0] = 0;
	dmc->tnd_table[1][0][0][0] = 0;

	dmc->apu = NULL;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_length = 7458;
	dmc->frame_sequence_steps = 4;

	for(c=0;c<2;++c)
		for(t=0;t<3;++t)
			dmc->sm[c][t] = 128;

	return dmc;
}